

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> __thiscall
slang::parsing::Parser::
parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseMember(slang::syntax::SyntaxKind,bool&)::__0>
          (Parser *this,TokenKind endKind,Token *endToken,SyntaxKind parentKind,
          anon_class_8_1_8991fb9c *parseFunc)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  Diagnostic *this_00;
  SourceLocation SVar3;
  undefined4 extraout_var;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  byte bVar4;
  byte bVar5;
  undefined6 in_register_00000032;
  Token TVar6;
  SourceRange range;
  string_view arg;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> sVar7;
  bool anyLocalModules;
  MemberSyntax *member;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  bool local_b9;
  Token local_b8;
  MemberSyntax *local_a8;
  Token *local_a0;
  Token *local_98;
  Token *local_90;
  SmallVectorBase<slang::syntax::MemberSyntax_*> local_88 [2];
  
  local_90 = (Token *)CONCAT62(in_register_00000032,endKind);
  local_88[0].data_ = (pointer)local_88[0].firstElement;
  local_88[0].len = 0;
  local_88[0].cap = 8;
  local_b9 = false;
  local_98 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_a0 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar4 = 0;
  do {
    TVar6 = ParserBase::peek(&this->super_ParserBase);
    bVar2 = false;
    if ((TVar6.kind != EndOfFile) && ((TVar6._0_4_ & 0xffff) != 0x95)) {
      local_a8 = parseMember(*(Parser **)endToken,GenerateRegion,&local_b9);
      if (local_a8 == (MemberSyntax *)0x0) {
        bVar2 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar6.kind);
        if (bVar2) {
          local_b8 = ParserBase::peek(&this->super_ParserBase);
          range = Token::range(&local_b8);
          this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
          local_b8 = ParserBase::peek(&this->super_ParserBase);
          arg = Token::valueText(&local_b8);
          Diagnostic::operator<<(this_00,arg);
          bVar4 = 1;
          if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
             ((this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
            SVar3 = Token::location(local_98);
            Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar3);
            SVar3 = Token::location(local_a0);
            Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar3);
          }
        }
        bVar5 = ~bVar4;
        bVar4 = 1;
        ParserBase::skipToken
                  (&this->super_ParserBase,
                   (optional<slang::DiagCode>)((uint6)(bVar5 & 1) << 0x20 | 0x450005));
      }
      else {
        checkMemberAllowed(this,&local_a8->super_SyntaxNode,GenerateRegion);
        SmallVectorBase<slang::syntax::MemberSyntax*>::
        emplace_back<slang::syntax::MemberSyntax*const&>
                  ((SmallVectorBase<slang::syntax::MemberSyntax*> *)local_88,&local_a8);
        pSVar1 = this->previewNode;
        this->previewNode = (SyntaxNode *)0x0;
        (local_a8->super_SyntaxNode).previewNode = pSVar1;
        bVar4 = 0;
      }
      bVar2 = true;
    }
  } while (bVar2);
  if (local_b9 == true) {
    SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pop_back(&(this->moduleDeclStack).
                super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              );
  }
  TVar6 = ParserBase::expect(&this->super_ParserBase,EndGenerateKeyword);
  *local_90 = TVar6;
  sVar7._M_ptr._0_4_ =
       SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                 (local_88,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)TVar6.info
                 );
  sVar7._M_ptr._4_4_ = extraout_var;
  if (local_88[0].data_ != (pointer)local_88[0].firstElement) {
    operator_delete(local_88[0].data_);
  }
  sVar7._M_extent._M_extent_value = extraout_RDX._M_extent_value;
  return sVar7;
}

Assistant:

std::span<TMember*> Parser::parseMemberList(TokenKind endKind, Token& endToken,
                                            SyntaxKind parentKind, TParseFunc&& parseFunc) {
    SmallVector<TMember*, 8> members;
    bool errored = false;
    bool anyLocalModules = false;

    while (true) {
        auto kind = peek().kind;
        if (kind == TokenKind::EndOfFile || kind == endKind)
            break;

        auto member = parseFunc(parentKind, anyLocalModules);
        if (member) {
            checkMemberAllowed(*member, parentKind);
            members.push_back(member);
            errored = false;

            member->previewNode = std::exchange(previewNode, nullptr);
        }
        else {
            if (isCloseDelimOrKeyword(kind)) {
                auto& diag = addDiag(diag::UnexpectedEndDelim, peek().range());
                diag << peek().valueText();
                errored = true;

                auto& lastBlock = getLastPoppedDelims();
                if (lastBlock.first && lastBlock.second) {
                    diag.addNote(diag::NoteLastBlockStarted, lastBlock.first.location());
                    diag.addNote(diag::NoteLastBlockEnded, lastBlock.second.location());
                }
            }

            skipToken(errored ? std::nullopt : std::make_optional(diag::ExpectedMember));
            errored = true;
        }
    }

    if (anyLocalModules)
        moduleDeclStack.pop_back();

    endToken = expect(endKind);
    return members.copy(alloc);
}